

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_EraseDoesNotResize_Test<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_EraseDoesNotResize_Test<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  iterator f;
  iterator l;
  bool bVar1;
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *this_00;
  AssertHelper *this_01;
  AssertHelper *this_02;
  long in_RDI;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  int i_1;
  size_type old_count;
  int i;
  key_type *in_stack_fffffffffffffe28;
  HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffe30;
  AssertHelper *this_03;
  uint *in_stack_fffffffffffffe38;
  unsigned_long *lhs;
  char *in_stack_fffffffffffffe40;
  char *rhs_expression;
  char *in_stack_fffffffffffffe48;
  char *lhs_expression;
  int line;
  char *in_stack_fffffffffffffe50;
  char *file;
  Type in_stack_fffffffffffffe5c;
  AssertHelper *in_stack_fffffffffffffe60;
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffea0;
  Message *in_stack_fffffffffffffea8;
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffeb0;
  AssertionResult in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffec8 [16];
  pointer in_stack_fffffffffffffed8;
  AssertionResult local_118;
  char *local_108;
  char *local_100;
  char *local_f8;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  undefined8 local_d0;
  AssertHelper *local_c8;
  unsigned_long *local_c0;
  undefined8 local_b0;
  AssertHelper *local_a8;
  unsigned_long *local_a0;
  key_type local_74;
  size_type local_70;
  undefined4 local_64;
  AssertionResult local_60;
  int local_4c;
  size_type local_48;
  value_type local_14;
  int local_10;
  key_type local_c;
  
  local_c = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey(in_stack_fffffffffffffe30,(int)((ulong)in_stack_fffffffffffffe28 >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key((BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                     *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  for (local_10 = 10; local_10 < 2000; local_10 = local_10 + 1) {
    local_14 = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueObject(in_stack_fffffffffffffe30,
                              (int)((ulong)in_stack_fffffffffffffe28 >> 0x20));
    google::
    BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffffeb0,(value_type *)in_stack_fffffffffffffea8);
  }
  local_48 = google::
             BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::bucket_count((BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                             *)0xeb9e72);
  for (local_4c = 10; local_4c < 1000; local_4c = local_4c + 1) {
    local_64 = 1;
    local_74 = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey(in_stack_fffffffffffffe30,(int)((ulong)in_stack_fffffffffffffe28 >> 0x20)
                          );
    local_70 = google::
               BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::erase((BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
              (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
               (unsigned_long *)in_stack_fffffffffffffe30);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_60);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffe60);
      testing::AssertionResult::failure_message((AssertionResult *)0xeb9f3e);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c,in_stack_fffffffffffffe50,
                 (int)((ulong)in_stack_fffffffffffffe48 >> 0x20),in_stack_fffffffffffffe40);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe30);
      testing::Message::~Message((Message *)0xeb9f9b);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xeba006);
  }
  this_00 = (BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             *)(in_RDI + 0x10);
  google::
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::begin(this_00);
  local_b0 = local_d0;
  local_a8 = local_c8;
  local_a0 = local_c0;
  google::
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(this_00);
  local_e8 = local_108;
  local_e0 = local_100;
  local_d8 = local_f8;
  f._8_16_ = in_stack_fffffffffffffeb8;
  f.ht = (dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          *)in_stack_fffffffffffffeb0;
  l.end = in_stack_fffffffffffffed8;
  l.ht = (dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          *)in_stack_fffffffffffffec8._0_8_;
  l.pos = (pointer)in_stack_fffffffffffffec8._8_8_;
  this_03 = local_a8;
  lhs = local_a0;
  google::
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::erase(in_stack_fffffffffffffea0,f,l);
  google::
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::size((BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          *)0xeba12c);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (local_100,local_108,(uint *)lhs,(unsigned_long *)this_03);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_118);
  rhs_expression = local_108;
  lhs_expression = local_100;
  file = local_f8;
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe60);
    testing::AssertionResult::failure_message((AssertionResult *)0xeba193);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c,local_f8,
               (int)((ulong)local_100 >> 0x20),local_108);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    testing::internal::AssertHelper::~AssertHelper(this_03);
    testing::Message::~Message((Message *)0xeba1f0);
    rhs_expression = local_108;
    lhs_expression = local_100;
    file = local_f8;
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xeba25e);
  this_01 = (AssertHelper *)
            google::
            BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::bucket_count((BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)0xeba26c);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            (lhs_expression,rhs_expression,lhs,(unsigned_long *)this_03);
  line = (int)((ulong)lhs_expression >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffffeb8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe60);
    this_02 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0xeba2e5)
    ;
    testing::internal::AssertHelper::AssertHelper
              (this_02,in_stack_fffffffffffffe5c,file,line,rhs_expression);
    testing::internal::AssertHelper::operator=(this_01,in_stack_fffffffffffffea8);
    testing::internal::AssertHelper::~AssertHelper(this_03);
    testing::Message::~Message((Message *)0xeba339);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xeba3a1);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, EraseDoesNotResize) {
  this->ht_.set_deleted_key(this->UniqueKey(1));
  for (int i = 10; i < 2000; i++) {
    this->ht_.insert(this->UniqueObject(i));
  }
  const typename TypeParam::size_type old_count = this->ht_.bucket_count();
  for (int i = 10; i < 1000; i++) {  // erase half one at a time
    EXPECT_EQ(1u, this->ht_.erase(this->UniqueKey(i)));
  }
  this->ht_.erase(this->ht_.begin(), this->ht_.end());  // and the rest at once
  EXPECT_EQ(0u, this->ht_.size());
  EXPECT_EQ(old_count, this->ht_.bucket_count());
}